

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<cmCMakePresetsGraphInternal::MatchesCondition> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraphInternal::MatchesCondition>::
Bind<cmCMakePresetsGraphInternal::MatchesCondition,std::__cxx11::string,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>>
          (Object<cmCMakePresetsGraphInternal::MatchesCondition> *this,string_view *name,
          offset_in_MatchesCondition_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          member,function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                 *func,bool required)

{
  Object<cmCMakePresetsGraphInternal::MatchesCondition> *pOVar1;
  MemberFunction local_70;
  anon_class_40_2_315d8239 local_50;
  
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  ::function(&local_50.func,func);
  local_50.member = member;
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraphInternal::MatchesCondition&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraphInternal::MatchesCondition>::Bind<cmCMakePresetsGraphInternal::MatchesCondition,std::__cxx11::string,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string_cmCMakePresetsGraphInternal::MatchesCondition::*,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>,bool)::_lambda(cmCMakePresetsGraphInternal::MatchesCondition&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraphInternal::MatchesCondition&,Json::Value_const*)>
              *)&local_70,&local_50);
  pOVar1 = BindPrivate(this,name,&local_70,required);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }